

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O2

_Bool help_greater_vault(chunk *c,loc_conflict centre,char *name)

{
  _Bool _Var1;
  uint32_t uVar2;
  int iVar3;
  uint uVar4;
  char *typ2;
  
  uVar4 = 0;
  if (centre.y < c->height) {
    uVar4 = (uint)(centre.x < c->width);
  }
  if (dun->cent_n - dun->nstair_room <= (int)uVar4) {
    uVar2 = 3;
    iVar3 = 1;
    for (typ2 = (char *)0x5a; c->depth < (wchar_t)typ2;
        typ2 = (char *)(ulong)(uint)((wchar_t)typ2 + L'\xfffffff6')) {
      iVar3 = iVar3 * 2;
      uVar2 = uVar2 * 3;
    }
    uVar2 = Rand_div(uVar2);
    if ((int)uVar2 < iVar3) {
      iVar3 = strcmp(dun->profile->name,"classic");
      if ((iVar3 != 0) && (uVar2 = Rand_div(3), uVar2 != 0)) {
        return false;
      }
      _Var1 = build_vault_type(c,centre,name,typ2);
      return _Var1;
    }
  }
  return false;
}

Assistant:

static bool help_greater_vault(struct chunk *c, struct loc centre,
		const char *name)
{
	int i;
	int numerator   = 1;
	int denominator = 3;
	
	/*
	 * Only try to build a GV as the first non-staircase room.  If not
	 * finding space, cent_n has already been incremented.
	 */
	if (dun->cent_n - dun->nstair_room > ((centre.y >= c->height ||
		centre.x >= c->width) ? 0 : 1)) return false;

	/* Level 90+ has a 1/3 chance, level 80-89 has 2/9, ... */
	for (i = 90; i > c->depth; i -= 10) {
		numerator *= 2;
		denominator *= 3;
	}

	/* Attempt to pass the depth check and build a GV */
	if (randint0(denominator) >= numerator) return false;

	/* Non-classic profiles need to adjust the probability */
	if (!streq(dun->profile->name, "classic") && !one_in_(3)) return false;

	return build_vault_type(c, centre, name, NULL);
}